

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsaes_oaep_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t *olen,uchar *input,uchar *output,
              size_t output_max_len)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  ulong dlen;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  mbedtls_md_context_t md_ctx;
  uchar lhash [64];
  uchar buf [1024];
  mbedtls_md_context_t local_490;
  byte local_478 [64];
  byte local_438;
  byte local_437 [1031];
  
  if ((mode != 1) || (iVar2 = -0x4080, ctx->padding == 1)) {
    uVar4 = ctx->len;
    iVar2 = -0x4080;
    if (0xfffffffffffffc0e < uVar4 - 0x401) {
      md_info = mbedtls_md_info_from_type(ctx->hash_id);
      if (md_info != (mbedtls_md_info_t *)0x0) {
        bVar1 = mbedtls_md_get_size(md_info);
        dlen = (ulong)bVar1;
        if ((uint)bVar1 * 2 + 2 <= uVar4) {
          if (mode == 0) {
            iVar2 = mbedtls_rsa_public(ctx,input,&local_438);
          }
          else {
            iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_438);
          }
          if (iVar2 == 0) {
            mbedtls_md_init(&local_490);
            iVar2 = mbedtls_md_setup(&local_490,md_info,0);
            if (iVar2 == 0) {
              mbedtls_md(md_info,label,label_len,local_478);
              mgf_mask(local_437,dlen,local_437 + dlen,~dlen + uVar4,&local_490);
              mgf_mask(local_437 + dlen,~dlen + uVar4,local_437,dlen,&local_490);
              mbedtls_md_free(&local_490);
              for (uVar3 = 0; dlen != uVar3; uVar3 = uVar3 + 1) {
                local_438 = local_438 | local_437[uVar3 + dlen] ^ local_478[uVar3];
              }
              lVar5 = 0;
              uVar7 = 0;
              for (lVar6 = 0; (uVar4 - (uint)bVar1 * 2) + -2 != lVar6; lVar6 = lVar6 + 1) {
                uVar7 = uVar7 | local_437[uVar3 + lVar6 + dlen];
                lVar5 = lVar5 + (ulong)((-uVar7 & 0xff | uVar7) >> 7 ^ 1);
              }
              lVar6 = lVar5 + dlen + -0x438;
              iVar2 = -0x4100;
              if (local_437[uVar3 + lVar6 + 0x438] == 1 && local_438 == 0) {
                uVar4 = (((uVar4 - dlen) - lVar5) - uVar3) - 2;
                iVar2 = -0x4400;
                if (uVar4 <= output_max_len) {
                  *olen = uVar4;
                  memcpy(output,local_437 + uVar3 + lVar6 + 0x439,uVar4);
                  iVar2 = 0;
                }
              }
            }
            else {
              mbedtls_md_free(&local_490);
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_decrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t *olen,
                            const unsigned char *input,
                            unsigned char *output,
                            size_t output_max_len )
{
    int ret;
    size_t ilen, i, pad_len;
    unsigned char *p, bad, pad_done;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char lhash[MBEDTLS_MD_MAX_SIZE];
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    /*
     * Parameters sanity checks
     */
    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    // checking for integer underflow
    if( 2 * hlen + 2 > ilen )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * RSA operation
     */
    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    /*
     * Unmask data and generate lHash
     */
    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }


    /* Generate lHash */
    mbedtls_md( md_info, label, label_len, lhash );

    /* seed: Apply seedMask to maskedSeed */
    mgf_mask( buf + 1, hlen, buf + hlen + 1, ilen - hlen - 1,
               &md_ctx );

    /* DB: Apply dbMask to maskedDB */
    mgf_mask( buf + hlen + 1, ilen - hlen - 1, buf + 1, hlen,
               &md_ctx );

    mbedtls_md_free( &md_ctx );

    /*
     * Check contents, in "constant-time"
     */
    p = buf;
    bad = 0;

    bad |= *p++; /* First byte must be 0 */

    p += hlen; /* Skip seed */

    /* Check lHash */
    for( i = 0; i < hlen; i++ )
        bad |= lhash[i] ^ *p++;

    /* Get zero-padding len, but always read till end of buffer
     * (minus one, for the 01 byte) */
    pad_len = 0;
    pad_done = 0;
    for( i = 0; i < ilen - 2 * hlen - 2; i++ )
    {
        pad_done |= p[i];
        pad_len += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
    }

    p += pad_len;
    bad |= *p++ ^ 0x01;

    /*
     * The only information "leaked" is whether the padding was correct or not
     * (eg, no data is copied if it was not correct). This meets the
     * recommendations in PKCS#1 v2.2: an opponent cannot distinguish between
     * the different error conditions.
     */
    if( bad != 0 )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}